

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnterLibrary.cpp
# Opt level: O2

void __thiscall EnterLibrary::operator()(EnterLibrary *this)

{
  HttpRequest *this_00;
  Session *this_01;
  bool bVar1;
  unsigned_short uVar2;
  string *psVar3;
  ostream *poVar4;
  reference this_02;
  Session *session;
  json Json;
  string reply;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = Session::IsConnected((this->super_Event).m_Owner);
  if (bVar1) {
    this_00 = &(this->super_Event).m_Request;
    HttpRequest::SetRequest(this_00,"GET","/api/v1/tema/library/access","HTTP/1.1","");
    HttpRequest::SetHost(this_00,"ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    HttpRequest::ClearHeaders(this_00);
    HttpRequest::AddHeader(this_00,"Connection","keep-alive");
    HttpRequest::ClearCookies(this_00);
    psVar3 = Session::GetConnectSid_abi_cxx11_((this->super_Event).m_Owner);
    HttpRequest::AddCookie(this_00,"connect.sid",(psVar3->_M_dataplus)._M_p);
    HttpRequest::SetData(this_00,"");
    Session::OpenConnection((this->super_Event).m_Owner);
    HttpRequest::Send(this_00,(this->super_Event).m_Owner);
    Connection::ReceiveHttps_abi_cxx11_(&local_60,(Connection *)(this->super_Event).m_Owner,session)
    ;
    Session::CloseConnection((this->super_Event).m_Owner);
    uVar2 = HttpReply::ExtractSign(&local_60);
    if (uVar2 == 200) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Enter library successfully");
      std::endl<char,std::char_traits<char>>(poVar4);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_70,(nullptr_t)0x0);
      HttpReply::ExtractData(&local_60,&local_70);
      this_01 = (this->super_Event).m_Owner;
      this_02 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            *)&local_70,"token");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_40,this_02);
      Session::SetToken(this_01,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_70);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Enter library failed ");
      poVar4 = std::operator<<(poVar4,"error ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,uVar2);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    std::__cxx11::string::~string((string *)&local_60);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"You are not connected");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Please login to proceed this command");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void EnterLibrary::operator()() {
    using namespace std;
    if (!m_Owner->IsConnected()) {
        cout << "You are not connected" << endl;
        cout << "Please login to proceed this command" << endl;
        return;
    }
    m_Request.SetRequest("GET", "/api/v1/tema/library/access", "HTTP/1.1");
    m_Request.SetHost("ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    m_Request.ClearHeaders();
    m_Request.AddHeader("Connection", "keep-alive");
    m_Request.ClearCookies();
    m_Request.AddCookie("connect.sid", m_Owner->GetConnectSid().c_str());
    m_Request.SetData("");
    m_Owner->OpenConnection();
    m_Request.Send(*m_Owner);
    std::string reply = Connection::ReceiveHttps(*m_Owner);
    m_Owner->CloseConnection();
    unsigned short sign = HttpReply::ExtractSign(reply);
    if (sign == 200) {
        cout << "Enter library successfully" << std::endl;
        json Json;
        HttpReply::ExtractData(reply, Json);
        m_Owner->SetToken(Json["token"]);
    }
    else {
        cout << "Enter library failed " << "error " << sign << std::endl;
    }
}